

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void shuffle(int *a,int n,int n2,int *tmp)

{
  int *pt;
  int *p2;
  int *p1;
  int i;
  int *tmp_local;
  int n2_local;
  int n_local;
  int *a_local;
  
  p1 = a + n2;
  pt = tmp;
  for (i = 1; i < n; i = i + 2) {
    *pt = *p1;
    pt = pt + 1;
    p1 = p1 + n2 * 2;
  }
  p1 = a + n2;
  p2 = a + n2 * 2;
  for (i = 2; i < n; i = i + 2) {
    *p1 = *p2;
    p1 = p1 + n2;
    p2 = p2 + n2 * 2;
  }
  pt = tmp;
  for (i = 1; i < n; i = i + 2) {
    *p1 = *pt;
    p1 = p1 + n2;
    pt = pt + 1;
  }
  return;
}

Assistant:

static void
shuffle(int a[], int n, int n2, int tmp[])
{

/* 
int a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
int tmp[];	 scratch storage					
*/

int i;
int *p1, *p2, *pt;

	/*
	 * copy odd elements to tmp
	 */
	pt = tmp;
	p1 = &a[n2];
	for (i=1; i < n; i += 2) {
		*pt = *p1;
		pt += 1;
		p1 += (n2+n2);
	}
	/*
	 * compress even elements into first half of A
	 */
	p1 = &a[n2];
	p2 = &a[n2+n2];
	for (i=2; i<n; i += 2) {
		*p1 = *p2;
		p1 += n2;
		p2 += (n2+n2);
	}
	/*
	 * put odd elements into 2nd half
	 */
	pt = tmp;
	for (i = 1; i<n; i += 2) {
		*p1 = *pt;
		p1 += n2;
		pt += 1;
	}
}